

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int vm_builtin_func_num_args(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  sxu32 sVar1;
  VmFrame *pVVar2;
  jx9_value *pObj;
  
  pVVar2 = pCtx->pVm->pFrame;
  if (pVVar2->pParent == (VmFrame *)0x0) {
    pObj = pCtx->pRet;
    jx9MemObjRelease(pObj);
    (pObj->x).iVal = -1;
  }
  else {
    sVar1 = (pVVar2->sArg).nUsed;
    pObj = pCtx->pRet;
    jx9MemObjRelease(pObj);
    pObj->x = (anon_union_8_3_18420de5_for_x)(long)(int)sVar1;
  }
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | 2;
  return 0;
}

Assistant:

static int vm_builtin_func_num_args(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	VmFrame *pFrame;
	jx9_vm *pVm;
	/* Point to the target VM */
	pVm = pCtx->pVm;
	/* Current frame */
	pFrame = pVm->pFrame;
	if( pFrame->pParent == 0 ){
		SXUNUSED(nArg);
		SXUNUSED(apArg);
		/* Global frame, return -1 */
		jx9_result_int(pCtx, -1);
		return SXRET_OK;
	}
	/* Total number of arguments passed to the enclosing function */
	nArg = (int)SySetUsed(&pFrame->sArg);
	jx9_result_int(pCtx, nArg);
	return SXRET_OK;
}